

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O1

mg_local_date_time * mg_local_date_time_copy(mg_local_date_time *param_1)

{
  int64_t iVar1;
  mg_local_date_time *pmVar2;
  
  if ((param_1 != (mg_local_date_time *)0x0) &&
     (pmVar2 = (mg_local_date_time *)mg_allocator_malloc(&mg_system_allocator,0x10),
     pmVar2 != (mg_local_date_time *)0x0)) {
    iVar1 = param_1->nanoseconds;
    pmVar2->seconds = param_1->seconds;
    pmVar2->nanoseconds = iVar1;
    return pmVar2;
  }
  return (mg_local_date_time *)0x0;
}

Assistant:

mg_local_date_time *mg_local_date_time_copy_ca(const mg_local_date_time *src,
                                               mg_allocator *allocator) {
  if (!src) {
    return NULL;
  }
  mg_local_date_time *local_date_time = mg_local_date_time_alloc(allocator);
  if (!local_date_time) {
    return NULL;
  }
  memcpy(local_date_time, src, sizeof(mg_local_date_time));
  return local_date_time;
}